

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# udp.c
# Opt level: O3

int udp_dialer_init(void *arg,nng_url *url,nni_dialer *ndialer)

{
  int iVar1;
  nni_sock *sock;
  
  sock = nni_dialer_sock(ndialer);
  *(nni_dialer **)((long)arg + 0x3f8) = ndialer;
  iVar1 = udp_ep_init((udp_ep *)arg,url,sock,ndialer,(nni_listener *)0x0);
  if (iVar1 != 0) {
    return iVar1;
  }
  iVar1 = udp_check_url(url,false);
  return iVar1;
}

Assistant:

static int
udp_dialer_init(void *arg, nng_url *url, nni_dialer *ndialer)
{
	udp_ep   *ep = arg;
	int       rv;
	nni_sock *sock = nni_dialer_sock(ndialer);

	ep->ndialer = ndialer;
	if ((rv = udp_ep_init(ep, url, sock, ndialer, NULL)) != 0) {
		return (rv);
	}

	if ((rv = udp_check_url(url, false)) != 0) {
		return (rv);
	}

	return (0);
}